

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

TEnableStr<const_char_*> __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::Serialize<char_const*>
          (Serializer<(Diligent::SerializerMode)0> *this,CharPtr Str)

{
  TEnable<unsigned_int> TVar1;
  Char *pCVar2;
  char (*pacVar3) [44];
  char (*in_R8) [13];
  TPointer local_90;
  undefined1 local_78 [8];
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  Uint32 LenWithNull;
  CharPtr Str_local;
  Serializer<(Diligent::SerializerMode)0> *this_local;
  
  msg.field_2._12_4_ = 0;
  TVar1 = Serialize<unsigned_int>(this,(ConstQual<unsigned_int> *)(msg.field_2._M_local_buf + 0xc));
  if (TVar1) {
    if (this->m_End < this->m_Ptr + (uint)msg.field_2._12_4_) {
      FormatString<char[26],unsigned_int,char[13]>
                ((string *)local_48,(Diligent *)"Note enough data to read ",
                 (char (*) [26])((long)&msg.field_2 + 0xc),(uint *)" characters.",in_R8);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"Serialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
                 ,0x16b);
      std::__cxx11::string::~string((string *)local_48);
      this_local._7_1_ = false;
    }
    else {
      if ((uint)msg.field_2._12_4_ < 2) {
        local_90 = "";
      }
      else {
        local_90 = this->m_Ptr;
      }
      *Str = (char *)local_90;
      if (**Str != '\0') {
        pacVar3 = (char (*) [44])strlen(*Str);
        if ((char (*) [44])(ulong)(uint)msg.field_2._12_4_ <= pacVar3) {
          FormatString<char[26],char[44]>
                    ((string *)local_78,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"Str[0] == \'\\0\' || strlen(Str) < LenWithNull",
                     (char (*) [44])(ulong)(uint)msg.field_2._12_4_);
          pCVar2 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar2,"Serialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
                     ,0x16e);
          std::__cxx11::string::~string((string *)local_78);
        }
      }
      this->m_Ptr = this->m_Ptr + (uint)msg.field_2._12_4_;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

typename Serializer<SerializerMode::Read>::TEnableStr<T> Serializer<SerializerMode::Read>::Serialize(CharPtr Str)
{
    Uint32 LenWithNull = 0;
    if (!Serialize<Uint32>(LenWithNull))
        return false;

    CHECK_REMAINING_SIZE(LenWithNull, "Note enough data to read ", LenWithNull, " characters.");

    Str = LenWithNull > 1 ? reinterpret_cast<const char*>(m_Ptr) : "";
    VERIFY_EXPR(Str[0] == '\0' || strlen(Str) < LenWithNull);
    m_Ptr += LenWithNull;
    return true;
}